

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O3

void ex_min(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  t_float *ptVar1;
  t_float *ptVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  t_float *ptVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  char *fmt;
  long lVar11;
  float fVar12;
  double dVar13;
  undefined1 auVar14 [16];
  int iVar17;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar23;
  undefined1 auVar22 [16];
  
  auVar6 = _DAT_001b53a0;
  auVar5 = _DAT_001b5390;
  auVar4 = _DAT_001b5380;
  lVar9 = argv->ex_type;
  if (lVar9 - 0xeU < 2) {
    if (optr->ex_type == 0xf) {
      ptVar7 = (optr->ex_cont).v_vec;
    }
    else {
      if (optr->ex_type == 0xe) {
LAB_0019cd8c:
        post("expr~: Int. error %d",0x205);
        abort();
      }
      optr->ex_type = 0xf;
      ptVar7 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar7;
    }
    ptVar2 = (argv->ex_cont).v_vec;
    lVar9 = argv[1].ex_type;
    if (lVar9 - 0xeU < 2) {
      iVar17 = e->exp_vsize;
      if (iVar17 == 0) {
        return;
      }
      ptVar1 = argv[1].ex_cont.v_vec;
      lVar9 = 0;
      do {
        fVar12 = ptVar1[lVar9];
        if (ptVar2[lVar9] <= ptVar1[lVar9]) {
          fVar12 = ptVar2[lVar9];
        }
        ptVar7[lVar9] = fVar12;
        lVar9 = lVar9 + 1;
      } while (iVar17 != (int)lVar9);
      return;
    }
    if (lVar9 == 2) {
      iVar17 = e->exp_vsize;
      if (iVar17 == 0) {
        return;
      }
      fVar12 = argv[1].ex_cont.v_flt;
      lVar9 = 0;
      do {
        fVar3 = fVar12;
        if (ptVar2[lVar9] <= fVar12) {
          fVar3 = ptVar2[lVar9];
        }
        ptVar7[lVar9] = fVar3;
        lVar9 = lVar9 + 1;
      } while (iVar17 != (int)lVar9);
      return;
    }
    if (lVar9 == 1) {
      iVar17 = e->exp_vsize;
      if (iVar17 == 0) {
        return;
      }
      lVar9 = argv[1].ex_cont.v_int;
      lVar11 = 0;
      do {
        fVar12 = (float)lVar9;
        if (ptVar2[lVar11] <= (float)lVar9) {
          fVar12 = ptVar2[lVar11];
        }
        ptVar7[lVar11] = fVar12;
        lVar11 = lVar11 + 1;
      } while (iVar17 != (int)lVar11);
      return;
    }
  }
  else if (lVar9 == 2) {
    lVar9 = argv[1].ex_type;
    if (lVar9 - 0xeU < 2) {
      if (optr->ex_type == 0xf) {
        ptVar7 = (optr->ex_cont).v_vec;
      }
      else {
        if (optr->ex_type == 0xe) goto LAB_0019cd8c;
        optr->ex_type = 0xf;
        ptVar7 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar7;
      }
      iVar17 = e->exp_vsize;
      if (iVar17 == 0) {
        return;
      }
      fVar12 = (argv->ex_cont).v_flt;
      ptVar2 = argv[1].ex_cont.v_vec;
      lVar9 = 0;
      do {
        fVar3 = ptVar2[lVar9];
        if (fVar12 <= ptVar2[lVar9]) {
          fVar3 = fVar12;
        }
        ptVar7[lVar9] = fVar3;
        lVar9 = lVar9 + 1;
      } while (iVar17 != (int)lVar9);
      return;
    }
    if (lVar9 == 2) {
      if (optr->ex_type == 0xf) {
        uVar8 = (ulong)(uint)e->exp_vsize;
        if (uVar8 == 0) {
          return;
        }
        fVar12 = argv[1].ex_cont.v_flt;
        if ((argv->ex_cont).v_flt <= argv[1].ex_cont.v_flt) {
          fVar12 = (argv->ex_cont).v_flt;
        }
        ptVar7 = (optr->ex_cont).v_vec;
        lVar9 = uVar8 - 1;
        auVar22._8_4_ = (int)lVar9;
        auVar22._0_8_ = lVar9;
        auVar22._12_4_ = (int)((ulong)lVar9 >> 0x20);
        uVar10 = 0;
        auVar22 = auVar22 ^ _DAT_001b53a0;
        do {
          auVar21._8_4_ = (int)uVar10;
          auVar21._0_8_ = uVar10;
          auVar21._12_4_ = (int)(uVar10 >> 0x20);
          auVar15 = (auVar21 | auVar5) ^ auVar6;
          iVar17 = auVar22._4_4_;
          if ((bool)(~(auVar15._4_4_ == iVar17 && auVar22._0_4_ < auVar15._0_4_ ||
                      iVar17 < auVar15._4_4_) & 1)) {
            ptVar7[uVar10] = fVar12;
          }
          if ((auVar15._12_4_ != auVar22._12_4_ || auVar15._8_4_ <= auVar22._8_4_) &&
              auVar15._12_4_ <= auVar22._12_4_) {
            ptVar7[uVar10 + 1] = fVar12;
          }
          auVar21 = (auVar21 | auVar4) ^ auVar6;
          iVar23 = auVar21._4_4_;
          if (iVar23 <= iVar17 && (iVar23 != iVar17 || auVar21._0_4_ <= auVar22._0_4_)) {
            ptVar7[uVar10 + 2] = fVar12;
            ptVar7[uVar10 + 3] = fVar12;
          }
          uVar10 = uVar10 + 4;
        } while ((uVar8 + 3 & 0xfffffffffffffffc) != uVar10);
        return;
      }
      optr->ex_type = 2;
      fVar12 = argv[1].ex_cont.v_flt;
      if ((argv->ex_cont).v_flt <= argv[1].ex_cont.v_flt) {
        fVar12 = (argv->ex_cont).v_flt;
      }
      goto LAB_0019cd81;
    }
    if (lVar9 == 1) {
      if (optr->ex_type == 0xf) {
        fVar12 = (argv->ex_cont).v_flt;
        if ((float)argv[1].ex_cont.v_int < fVar12) {
          fVar12 = (float)argv[1].ex_cont.v_int;
        }
        uVar8 = (ulong)(uint)e->exp_vsize;
        if (uVar8 == 0) {
          return;
        }
        ptVar7 = (optr->ex_cont).v_vec;
        lVar9 = uVar8 - 1;
        auVar15._8_4_ = (int)lVar9;
        auVar15._0_8_ = lVar9;
        auVar15._12_4_ = (int)((ulong)lVar9 >> 0x20);
        uVar10 = 0;
        auVar15 = auVar15 ^ _DAT_001b53a0;
        do {
          auVar19._8_4_ = (int)uVar10;
          auVar19._0_8_ = uVar10;
          auVar19._12_4_ = (int)(uVar10 >> 0x20);
          auVar22 = (auVar19 | auVar5) ^ auVar6;
          iVar17 = auVar15._4_4_;
          if ((bool)(~(auVar22._4_4_ == iVar17 && auVar15._0_4_ < auVar22._0_4_ ||
                      iVar17 < auVar22._4_4_) & 1)) {
            ptVar7[uVar10] = fVar12;
          }
          if ((auVar22._12_4_ != auVar15._12_4_ || auVar22._8_4_ <= auVar15._8_4_) &&
              auVar22._12_4_ <= auVar15._12_4_) {
            ptVar7[uVar10 + 1] = fVar12;
          }
          auVar22 = (auVar19 | auVar4) ^ auVar6;
          iVar23 = auVar22._4_4_;
          if (iVar23 <= iVar17 && (iVar23 != iVar17 || auVar22._0_4_ <= auVar15._0_4_)) {
            ptVar7[uVar10 + 2] = fVar12;
            ptVar7[uVar10 + 3] = fVar12;
          }
          uVar10 = uVar10 + 4;
        } while ((uVar8 + 3 & 0xfffffffffffffffc) != uVar10);
        return;
      }
      optr->ex_type = 2;
      fVar12 = (argv->ex_cont).v_flt;
      fVar3 = (float)argv[1].ex_cont.v_int;
      if (fVar12 <= fVar3) goto LAB_0019cd81;
      goto LAB_0019cd67;
    }
  }
  else {
    if (lVar9 != 1) {
      fmt = "expr: FUNC_EVAL(%d): bad left type %ld\n";
      goto LAB_0019c96a;
    }
    lVar9 = argv[1].ex_type;
    if (lVar9 - 0xeU < 2) {
      if (optr->ex_type == 0xf) {
        ptVar7 = (optr->ex_cont).v_vec;
      }
      else {
        if (optr->ex_type == 0xe) goto LAB_0019cd8c;
        optr->ex_type = 0xf;
        ptVar7 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar7;
      }
      iVar17 = e->exp_vsize;
      if (iVar17 == 0) {
        return;
      }
      lVar9 = (argv->ex_cont).v_int;
      ptVar2 = argv[1].ex_cont.v_vec;
      lVar11 = 0;
      do {
        fVar12 = ptVar2[lVar11];
        if ((float)lVar9 <= ptVar2[lVar11]) {
          fVar12 = (float)lVar9;
        }
        ptVar7[lVar11] = fVar12;
        lVar11 = lVar11 + 1;
      } while (iVar17 != (int)lVar11);
      return;
    }
    if (lVar9 == 2) {
      if (optr->ex_type == 0xf) {
        fVar12 = argv[1].ex_cont.v_flt;
        if ((float)(argv->ex_cont).v_int <= fVar12) {
          fVar12 = (float)(argv->ex_cont).v_int;
        }
        uVar8 = (ulong)(uint)e->exp_vsize;
        if (uVar8 == 0) {
          return;
        }
        ptVar7 = (optr->ex_cont).v_vec;
        lVar9 = uVar8 - 1;
        auVar16._8_4_ = (int)lVar9;
        auVar16._0_8_ = lVar9;
        auVar16._12_4_ = (int)((ulong)lVar9 >> 0x20);
        uVar10 = 0;
        auVar16 = auVar16 ^ _DAT_001b53a0;
        do {
          auVar20._8_4_ = (int)uVar10;
          auVar20._0_8_ = uVar10;
          auVar20._12_4_ = (int)(uVar10 >> 0x20);
          auVar22 = (auVar20 | auVar5) ^ auVar6;
          iVar17 = auVar16._4_4_;
          if ((bool)(~(auVar22._4_4_ == iVar17 && auVar16._0_4_ < auVar22._0_4_ ||
                      iVar17 < auVar22._4_4_) & 1)) {
            ptVar7[uVar10] = fVar12;
          }
          if ((auVar22._12_4_ != auVar16._12_4_ || auVar22._8_4_ <= auVar16._8_4_) &&
              auVar22._12_4_ <= auVar16._12_4_) {
            ptVar7[uVar10 + 1] = fVar12;
          }
          auVar22 = (auVar20 | auVar4) ^ auVar6;
          iVar23 = auVar22._4_4_;
          if (iVar23 <= iVar17 && (iVar23 != iVar17 || auVar22._0_4_ <= auVar16._0_4_)) {
            ptVar7[uVar10 + 2] = fVar12;
            ptVar7[uVar10 + 3] = fVar12;
          }
          uVar10 = uVar10 + 4;
        } while ((uVar8 + 3 & 0xfffffffffffffffc) != uVar10);
        return;
      }
      optr->ex_type = 2;
      fVar3 = (float)(argv->ex_cont).v_int;
      fVar12 = argv[1].ex_cont.v_flt;
      if (argv[1].ex_cont.v_flt < fVar3) goto LAB_0019cd81;
LAB_0019cd67:
      fVar12 = fVar3;
LAB_0019cd81:
      (optr->ex_cont).v_flt = fVar12;
      return;
    }
    if (lVar9 == 1) {
      if (optr->ex_type != 0xf) {
        optr->ex_type = 1;
        dVar13 = (double)argv[1].ex_cont.v_int;
        if ((double)(argv->ex_cont).v_int <= (double)argv[1].ex_cont.v_int) {
          dVar13 = (double)(argv->ex_cont).v_int;
        }
        optr->ex_cont = (anon_union_8_5_735de1bb_for_ex_cont)(long)(int)dVar13;
        return;
      }
      uVar8 = (ulong)(uint)e->exp_vsize;
      if (uVar8 == 0) {
        return;
      }
      dVar13 = (double)argv[1].ex_cont.v_int;
      if ((double)(argv->ex_cont).v_int <= (double)argv[1].ex_cont.v_int) {
        dVar13 = (double)(argv->ex_cont).v_int;
      }
      fVar12 = (float)dVar13;
      ptVar7 = (optr->ex_cont).v_vec;
      lVar9 = uVar8 - 1;
      auVar14._8_4_ = (int)lVar9;
      auVar14._0_8_ = lVar9;
      auVar14._12_4_ = (int)((ulong)lVar9 >> 0x20);
      uVar10 = 0;
      auVar14 = auVar14 ^ _DAT_001b53a0;
      do {
        auVar18._8_4_ = (int)uVar10;
        auVar18._0_8_ = uVar10;
        auVar18._12_4_ = (int)(uVar10 >> 0x20);
        auVar22 = (auVar18 | auVar5) ^ auVar6;
        iVar17 = auVar14._4_4_;
        if ((bool)(~(auVar22._4_4_ == iVar17 && auVar14._0_4_ < auVar22._0_4_ ||
                    iVar17 < auVar22._4_4_) & 1)) {
          ptVar7[uVar10] = fVar12;
        }
        if ((auVar22._12_4_ != auVar14._12_4_ || auVar22._8_4_ <= auVar14._8_4_) &&
            auVar22._12_4_ <= auVar14._12_4_) {
          ptVar7[uVar10 + 1] = fVar12;
        }
        auVar22 = (auVar18 | auVar4) ^ auVar6;
        iVar23 = auVar22._4_4_;
        if (iVar23 <= iVar17 && (iVar23 != iVar17 || auVar22._0_4_ <= auVar14._0_4_)) {
          ptVar7[uVar10 + 2] = fVar12;
          ptVar7[uVar10 + 3] = fVar12;
        }
        uVar10 = uVar10 + 4;
      } while ((uVar8 + 3 & 0xfffffffffffffffc) != uVar10);
      return;
    }
  }
  fmt = "expr: FUNC_EVAL(%d): bad right type %ld\n";
LAB_0019c96a:
  pd_error(e,fmt,0x205);
  return;
}

Assistant:

static void
ex_min(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left, *right;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;
        right = argv;

        FUNC_EVAL(left, right, min, (double), (double), optr, 0);
}